

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  h264_cabac_context *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int max;
  int pmode [4];
  int ifrom [4];
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_30;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RCX[1] < 0x1b) {
    iVar1 = h264_is_intra_16x16_mb_type(in_RCX[1]);
    if (iVar1 == 0) {
      if (in_RCX[3] == 0) {
        for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
          iVar1 = h264_prev_intra_pred_mode_flag
                            ((bitstream *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (h264_cabac_context *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          if (iVar1 != 0) {
            return 1;
          }
          if ((in_RCX[(long)local_2c + 0x305] == 0) &&
             (iVar1 = h264_rem_intra_pred_mode
                                ((bitstream *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (h264_cabac_context *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (uint32_t *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
             iVar1 != 0)) {
            return 1;
          }
        }
      }
      else {
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          iVar1 = h264_prev_intra_pred_mode_flag
                            ((bitstream *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (h264_cabac_context *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          if (iVar1 != 0) {
            return 1;
          }
          if ((in_RCX[(long)local_2c + 0x325] == 0) &&
             (iVar1 = h264_rem_intra_pred_mode
                                ((bitstream *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (h264_cabac_context *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (uint32_t *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
             iVar1 != 0)) {
            return 1;
          }
        }
      }
    }
    if ((*(int *)(in_RDX + 0xc0c) == 1) || (*(int *)(in_RDX + 0xc0c) == 2)) {
      iVar1 = h264_intra_chroma_pred_mode
                        ((bitstream *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (h264_cabac_context *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (uint32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else if (in_RCX[1] == 0x21) {
    iVar1 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra((bitstream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (h264_macroblock *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = mb_part_info[in_RCX[1]][1];
    iVar4 = mb_part_info[in_RCX[1]][0];
    if (((iVar4 != 0) && (iVar4 != 1)) && (iVar4 == 2)) {
      in_stack_ffffffffffffffac = mb_part_info[in_RCX[1]][2];
    }
    iVar2 = *(int *)(in_RDX + 0x78);
    if ((*(int *)(in_RDX + 0xc28) != 0) && (*in_RCX != 0)) {
      iVar2 = iVar2 * 2 + 1;
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (*(int *)(&stack0xffffffffffffffb8 + (long)local_2c * 4) == -1) {
        if ((*(uint *)(&stack0xffffffffffffffa8 + (long)local_2c * 4) & 1) == 0) {
          iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                           (uint32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_ref_idx((bitstream *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDX >> 0x20)
                               ,in_RCX);
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                         (uint32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    iVar2 = *(int *)(in_RDX + 0x7c);
    if ((*(int *)(in_RDX + 0xc28) != 0) && (*in_RCX != 0)) {
      iVar2 = iVar2 * 2 + 1;
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (*(int *)(&stack0xffffffffffffffb8 + (long)local_2c * 4) == -1) {
        if ((*(uint *)(&stack0xffffffffffffffa8 + (long)local_2c * 4) & 2) == 0) {
          iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                           (uint32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_ref_idx((bitstream *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDX >> 0x20)
                               ,in_RCX);
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar3 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                         (uint32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (*(int *)(&stack0xffffffffffffffb8 + (long)local_2c * 4) == -1) {
        if ((*(uint *)(&stack0xffffffffffffffa8 + (long)local_2c * 4) & 1) == 0) {
          iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                            (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                            (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_mvd((bitstream *)pmode._8_8_,(h264_cabac_context *)pmode._0_8_,max,
                           in_stack_00000008,unaff_retaddr,
                           (int32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
          ;
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = h264_mvd((bitstream *)pmode._8_8_,(h264_cabac_context *)pmode._0_8_,max,
                           in_stack_00000008,unaff_retaddr,
                           (int32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
          ;
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
      for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (*(int *)(&stack0xffffffffffffffb8 + (long)local_2c * 4) == -1) {
        if ((*(uint *)(&stack0xffffffffffffffa8 + (long)local_2c * 4) & 2) == 0) {
          iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                            (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                            (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          iVar3 = h264_mvd((bitstream *)pmode._8_8_,(h264_cabac_context *)pmode._0_8_,max,
                           in_stack_00000008,unaff_retaddr,
                           (int32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
          ;
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = h264_mvd((bitstream *)pmode._8_8_,(h264_cabac_context *)pmode._0_8_,max,
                           in_stack_00000008,unaff_retaddr,
                           (int32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
          ;
          if (iVar3 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
      for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = vs_infers((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (int32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    iVar1 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                     (uint32_t *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffff9c);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i, j;
	if (mb->mb_type < H264_MB_TYPE_P_BASE) {
		if (!h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (!mb->transform_size_8x8_flag) {
				for (i = 0; i < 16; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra4x4_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra4x4_pred_mode[i])) return 1;
				}
			} else {
				for (i = 0; i < 4; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra8x8_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra8x8_pred_mode[i])) return 1;
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			if (h264_intra_chroma_pred_mode(str, cabac, &mb->intra_chroma_pred_mode)) return 1;
		} else {
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		}
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	} else if (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16) {
		int ifrom[4], pmode[4];
		ifrom[0] = -1;
		pmode[0] = mb_part_info[mb->mb_type][1];
		switch (mb_part_info[mb->mb_type][0]) {
			case 0: /* 16x16 */
				ifrom[1] = 0;
				ifrom[2] = 0;
				ifrom[3] = 0;
				break;
			case 1: /* 16x8 */
				ifrom[1] = 0;
				ifrom[2] = -1;
				ifrom[3] = 2;
				pmode[2] = mb_part_info[mb->mb_type][2];
				break;
			case 2:
				ifrom[1] = -1;
				ifrom[2] = 0;
				ifrom[3] = 1;
				pmode[1] = mb_part_info[mb->mb_type][2];
				break;
		}
		int max = slice->num_ref_idx_l0_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[0][i], mb->ref_idx[0][ifrom[i]])) return 1;
			}
		}
		max = slice->num_ref_idx_l1_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[1][i], mb->ref_idx[1][ifrom[i]])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_mvd(str, cabac, i * 4, 0, 0, &mb->mvd[0][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 0, &mb->mvd[0][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[0][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[0][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[0][i*4][0], mb->mvd[0][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4][1], mb->mvd[0][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[0][i*4+j][0], mb->mvd[0][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4+j][1], mb->mvd[0][i*4][1])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_mvd(str, cabac, i * 4, 0, 1, &mb->mvd[1][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 1, &mb->mvd[1][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[1][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[1][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[1][i*4][0], mb->mvd[1][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4][1], mb->mvd[1][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[1][i*4+j][0], mb->mvd[1][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4+j][1], mb->mvd[1][i*4][1])) return 1;
			}
		}
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	} else {
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	}
	return 0;
}